

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ISMSnoop::ISMSnoop(ISMSnoop *this,ISMSnoopLib *lib)

{
  DynamicLibrary *pDVar1;
  undefined1 local_308 [8];
  ResultBuilder __catchResult;
  SourceLineInfo local_58;
  
  pDVar1 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)local_308,"ismsnoop_open",(allocator *)&local_58);
  rtw::DynamicLibrary::get_function<ISMSnoopInstrument*(char_const*)>
            (&this->open,pDVar1,(string *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  pDVar1 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)local_308,"ismsnoop_close",(allocator *)&local_58);
  __catchResult._664_8_ = &this->close;
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*)>
            ((function<void_(ISMSnoopInstrument_*)> *)__catchResult._664_8_,pDVar1,
             (string *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  pDVar1 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)local_308,"ismsnoop_get_panel_icon_size",(allocator *)&local_58);
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*,int*,int*,int*)>
            (&this->get_panel_icon_size,pDVar1,(string *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  pDVar1 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)local_308,"ismsnoop_get_panel_icon_bytes",(allocator *)&local_58);
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*,char*)>
            (&this->get_panel_icon_bytes,pDVar1,(string *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  pDVar1 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)local_308,"ismsnoop_get_name",(allocator *)&local_58);
  rtw::DynamicLibrary::get_function<void(ISMSnoopInstrument*,char*,int*)>
            (&this->get_name,pDVar1,(string *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,0x2e);
  Catch::ResultBuilder::ResultBuilder((ResultBuilder *)local_308,"REQUIRE",&local_58,"open",Normal);
  std::__cxx11::string::~string((string *)&local_58);
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)this;
  Catch::ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&>::endExpression
            ((ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&> *)&local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,0x2f);
  Catch::ResultBuilder::ResultBuilder((ResultBuilder *)local_308,"REQUIRE",&local_58,"close",Normal)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  local_58.file._M_string_length._0_1_ = __catchResult.m_shouldDebugBreak;
  local_58.file._M_string_length._1_1_ = __catchResult.m_shouldThrow;
  local_58.file._M_string_length._2_6_ = __catchResult._666_6_;
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&>::endExpression
            ((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&> *)&local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,0x30);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_308,"REQUIRE",&local_58,"get_panel_icon_size",Normal);
  std::__cxx11::string::~string((string *)&local_58);
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)&this->get_panel_icon_size;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&>::
  endExpression((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&>
                 *)&local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,0x31);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_308,"REQUIRE",&local_58,"get_panel_icon_bytes",Normal);
  std::__cxx11::string::~string((string *)&local_58);
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)&this->get_panel_icon_bytes;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&>::endExpression
            ((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&> *)&local_58)
  ;
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,0x32);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_308,"REQUIRE",&local_58,"get_name",Normal);
  std::__cxx11::string::~string((string *)&local_58);
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)&this->get_name;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&>::
  endExpression((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&> *)
                &local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  return;
}

Assistant:

ISMSnoop::ISMSnoop(const ISMSnoopLib & lib)
	: open(lib.lib->get_function<Sig_ismsnoop_open>("ismsnoop_open"))
	, close(lib.lib->get_function<Sig_ismsnoop_close>("ismsnoop_close"))
	, get_panel_icon_size(lib.lib->get_function<Sig_ismsnoop_get_panel_icon_size>("ismsnoop_get_panel_icon_size"))
	, get_panel_icon_bytes(lib.lib->get_function<Sig_ismsnoop_get_panel_icon_bytes>("ismsnoop_get_panel_icon_bytes"))
	, get_name(lib.lib->get_function<Sig_ismsnoop_get_name>("ismsnoop_get_name"))
{
	REQUIRE(open);
	REQUIRE(close);
	REQUIRE(get_panel_icon_size);
	REQUIRE(get_panel_icon_bytes);
	REQUIRE(get_name);
}